

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long lVar2;
  nonempty_iterator ppVar3;
  long lVar4;
  long lVar5;
  long in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  iterator *in_stack_fffffffffffff8d8;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8e0;
  AssertHelper *this_01;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8e8;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  char *in_stack_fffffffffffff8f0;
  char *rhs_expression;
  char *in_stack_fffffffffffff8f8;
  int iVar6;
  char *lhs_expression;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff900;
  char *file;
  undefined8 in_stack_fffffffffffff908;
  Type TVar8;
  undefined8 uVar7;
  AssertHelper *in_stack_fffffffffffff910;
  AssertHelper *this_03;
  char *in_stack_fffffffffffff940;
  char *in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  AssertionResult *in_stack_fffffffffffff958;
  AssertHelper *in_stack_fffffffffffff960;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff970;
  key_type *in_stack_fffffffffffff978;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_04;
  _Vector_impl_data *p_Var9;
  value_type *in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa38 [16];
  undefined8 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  iterator in_stack_fffffffffffffa58;
  undefined1 local_548 [56];
  Message *pMStack_510;
  AssertHelper *local_508;
  undefined1 local_500 [80];
  undefined1 local_4b0 [8];
  AssertHelper *pAStack_4a8;
  uint *local_4a0;
  char *pcStack_498;
  char *local_490;
  char *pcStack_488;
  undefined8 local_480;
  Type TStack_47c;
  AssertHelper *pAStack_478;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [7];
  int local_3cc;
  size_type local_3b8;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  undefined1 local_398 [8];
  AssertHelper *pAStack_390;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_388;
  char *pcStack_380;
  char *local_378;
  char *pcStack_370;
  undefined8 local_368;
  AssertHelper *pAStack_360;
  string local_350 [135];
  undefined1 local_2c9;
  AssertionResult local_2c8;
  key_type local_2b8;
  undefined1 local_2b0 [96];
  size_type local_250;
  undefined4 local_244;
  AssertionResult local_240 [2];
  key_type local_220;
  size_type local_218;
  undefined4 local_20c;
  AssertionResult local_208 [2];
  size_type local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8 [2];
  key_type local_1b8;
  size_type local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0 [2];
  size_type local_180;
  undefined4 local_174;
  AssertionResult local_170 [2];
  key_type local_150;
  size_type local_148;
  undefined4 local_13c;
  AssertionResult local_138 [6];
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  local_d0;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_10;
  
  TVar8 = (Type)((ulong)in_stack_fffffffffffff908 >> 0x20);
  this_00 = (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_10 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff8e0,(key_type *)in_stack_fffffffffffff8d8);
  local_24 = 0;
  lVar2 = in_RDI + 0x10;
  local_d0.ht_.rep.table.settings.num_buckets =
       (size_type)
       HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase(in_stack_fffffffffffff8e0,(key_type *)in_stack_fffffffffffff8d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    in_stack_fffffffffffffa18 =
         (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0xe9e775);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,
               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9e7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9e849);
  p_Var9 = (_Vector_impl_data *)
           ((long)&local_d0.ht_.rep.table.groups.
                   super__Vector_base<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           + 0x10);
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,in_stack_fffffffffffffa18);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xe9e8a6);
  this_04 = &local_d0;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff8e8,(int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,in_stack_fffffffffffffa18);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xe9e903);
  local_13c = 1;
  local_150 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20))
  ;
  local_148 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffff8e0,(key_type *)in_stack_fffffffffffff8d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0xe9ea11);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,
               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9ea74);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9eae2);
  local_174 = 1;
  local_180 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe9eafe);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0xe9eb77);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,
               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9ebda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9ec4b);
  local_1a4 = 0;
  local_1b8 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20))
  ;
  local_1b0 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffff8e0,(key_type *)in_stack_fffffffffffff8d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0xe9ed0d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,
               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9ed70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9edde);
  local_1dc = 1;
  local_1e8 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe9edfa);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0xe9ee73);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,
               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9eed6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9ef47);
  local_20c = 0;
  ppVar3 = (nonempty_iterator)(in_RDI + 0x10);
  local_220 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20))
  ;
  local_218 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffff8e0,(key_type *)in_stack_fffffffffffff8d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    in_stack_fffffffffffff9b8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe9f009);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,
               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9f06c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9f0da);
  local_244 = 1;
  local_250 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe9f0f6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,(uint *)in_stack_fffffffffffff8e8,
             (unsigned_long *)in_stack_fffffffffffff8e0);
  iVar6 = (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    in_stack_fffffffffffff9b0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe9f16f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,iVar6,
               in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0xe9f1d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9f243);
  lVar4 = in_RDI + 0x10;
  local_2b8 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff900,iVar6);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffff980);
  local_2c9 = google::
              sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
             (type *)0xe9f2d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,in_stack_fffffffffffff948,
               in_stack_fffffffffffff940);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,TVar8,(char *)in_stack_fffffffffffff900,iVar6,
               in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    std::__cxx11::string::~string(local_350);
    testing::Message::~Message((Message *)0xe9f3ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9f443);
  lVar5 = in_RDI + 0x10;
  memcpy(local_398,local_2b0,0x48);
  it_00.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff988;
  it_00.ht = (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff980;
  it_00.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff990;
  it_00.pos.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff998;
  it_00.pos.col_current = (nonempty_iterator)lVar5;
  it_00.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)lVar4;
  it_00.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9b0;
  it_00.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9b8;
  it_00.end.col_current = ppVar3;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffff970,it_00);
  local_3ac = 0;
  local_3b8 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe9f4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_378,pcStack_380,(uint *)local_388,(unsigned_long *)pAStack_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  this_01 = pAStack_390;
  this_02 = local_388;
  rhs_expression = pcStack_380;
  lhs_expression = local_378;
  file = pcStack_370;
  uVar7 = local_368;
  this_03 = pAStack_360;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_360);
    testing::AssertionResult::failure_message((AssertionResult *)0xe9f551);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_360,(Type)((ulong)local_368 >> 0x20),pcStack_370,
               (int)((ulong)local_378 >> 0x20),pcStack_380);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper(pAStack_390);
    testing::Message::~Message((Message *)0xe9f5b4);
    this_01 = pAStack_390;
    this_02 = local_388;
    rhs_expression = pcStack_380;
    lhs_expression = local_378;
    file = pcStack_370;
    uVar7 = local_368;
    this_03 = pAStack_360;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9f625);
  local_3cc = 10;
  while( true ) {
    TVar8 = (Type)((ulong)uVar7 >> 0x20);
    if (99 < local_3cc) break;
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_02,(int)((ulong)this_01 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_00,in_stack_fffffffffffffa18);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xe9f69d);
    local_3cc = local_3cc + 1;
  }
  local_44c = 0x5a;
  local_458 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe9f704);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,(uint *)this_02,(unsigned_long *)this_01);
  iVar6 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_fffffffffffff980 =
         (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe9f76b);
    testing::internal::AssertHelper::AssertHelper(this_03,TVar8,file,iVar6,rhs_expression);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xe9f7ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9f83f);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff980);
  memcpy(local_4b0,local_500,0x48);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffff980);
  memcpy(local_548,&stack0xfffffffffffffa68,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa18;
  f.ht = (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)p_Var9;
  f.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)this_00;
  f.pos.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_RDI;
  f.pos.col_current = (nonempty_iterator)lVar2;
  f.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa38._0_8_;
  f.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa38._8_8_;
  f.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffa48;
  f.end.col_current._0_4_ = in_stack_fffffffffffffa50;
  f.end.col_current._4_4_ = in_stack_fffffffffffffa54;
  TVar8 = TStack_47c;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(this_04,f,in_stack_fffffffffffffa58);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe9f962);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_490,pcStack_498,local_4a0,(unsigned_long *)pAStack_4a8);
  iVar6 = (int)((ulong)local_490 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffa58);
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_478);
    testing::AssertionResult::failure_message((AssertionResult *)0xe9f9db);
    testing::internal::AssertHelper::AssertHelper(pAStack_478,TVar8,pcStack_488,iVar6,pcStack_498);
    testing::internal::AssertHelper::operator=(local_508,pMStack_510);
    testing::internal::AssertHelper::~AssertHelper(pAStack_4a8);
    testing::Message::~Message((Message *)0xe9fa3e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe9faa9);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}